

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_annotationbase.cpp
# Opt level: O2

void __thiscall
ON_Annotation::SetSuffix(ON_Annotation *this,ON_DimStyle *parent_style,wchar_t *suffix)

{
  bool bVar1;
  ON_DimStyle *pOVar2;
  ON_wString *this_00;
  wchar_t *string2;
  
  pOVar2 = ON_DimStyle::DimStyleOrDefault(parent_style);
  this_00 = ON_DimStyle::Suffix(pOVar2);
  string2 = ON_wString::operator_cast_to_wchar_t_(this_00);
  bVar1 = ON_wString::EqualOrdinal(suffix,string2,false);
  pOVar2 = Internal_GetOverrideStyle(this,!bVar1);
  if (pOVar2 != (ON_DimStyle *)0x0) {
    ON_DimStyle::SetSuffix(pOVar2,suffix);
    ON_DimStyle::SetFieldOverride(pOVar2,Suffix,!bVar1);
    return;
  }
  return;
}

Assistant:

void ON_Annotation::SetSuffix(const ON_DimStyle* parent_style, const wchar_t* suffix)
{
  parent_style = &ON_DimStyle::DimStyleOrDefault(parent_style);
  bool bCreate = !ON_wString::EqualOrdinal(suffix, parent_style->Suffix(), false);
  ON_DimStyle* override_style = Internal_GetOverrideStyle(bCreate);
  if (nullptr != override_style)
  {
    override_style->SetSuffix(suffix);
    override_style->SetFieldOverride(ON_DimStyle::field::Suffix, bCreate);
  }
}